

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast_socket.cpp
# Opt level: O0

bool libtorrent::is_local(address *a)

{
  bool bVar1;
  byte *pbVar2;
  unsigned_long uVar3;
  bool local_52;
  bool local_51;
  unsigned_long ip;
  undefined1 auStack_40 [4];
  address_v4 a4;
  undefined1 local_30 [8];
  address_v6 a6;
  address *a_local;
  
  a6.scope_id_ = (unsigned_long)a;
  bVar1 = boost::asio::ip::address::is_v6(a);
  if (bVar1) {
    boost::asio::ip::address::to_v6((address_v6 *)local_30,(address *)a6.scope_id_);
    bVar1 = boost::asio::ip::address_v6::is_loopback((address_v6 *)local_30);
    local_51 = true;
    if (!bVar1) {
      bVar1 = boost::asio::ip::address_v6::is_link_local((address_v6 *)local_30);
      local_51 = true;
      if (!bVar1) {
        bVar1 = boost::asio::ip::address_v6::is_site_local((address_v6 *)local_30);
        local_51 = true;
        if (!bVar1) {
          bVar1 = boost::asio::ip::address_v6::is_multicast_link_local((address_v6 *)local_30);
          local_51 = true;
          if (!bVar1) {
            bVar1 = boost::asio::ip::address_v6::is_multicast_site_local((address_v6 *)local_30);
            local_51 = true;
            if (!bVar1) {
              _auStack_40 = boost::asio::ip::address_v6::to_bytes((address_v6 *)local_30);
              pbVar2 = std::array<unsigned_char,_16UL>::operator[]
                                 ((array<unsigned_char,_16UL> *)auStack_40,0);
              local_51 = (*pbVar2 & 0xfe) == 0xfc;
            }
          }
        }
      }
    }
    a_local._7_1_ = local_51;
  }
  else {
    boost::asio::ip::address::to_v4((address *)((long)&ip + 4));
    uVar3 = boost::asio::ip::address_v4::to_ulong((address_v4 *)((long)&ip + 4));
    local_52 = true;
    if (((((uVar3 & 0xff000000) != 0xa000000) &&
         (local_52 = true, (uVar3 & 0xfff00000) != 0xac100000)) &&
        (local_52 = true, (uVar3 & 0xffff0000) != 0xc0a80000)) &&
       (local_52 = true, (uVar3 & 0xffff0000) != 0xa9fe0000)) {
      local_52 = (uVar3 & 0xff000000) == 0x7f000000;
    }
    a_local._7_1_ = local_52;
  }
  return a_local._7_1_;
}

Assistant:

bool is_local(address const& a)
	{
		if (a.is_v6())
		{
			// NOTE: site local is deprecated but by
			// https://www.ietf.org/rfc/rfc3879.txt:
			// routers SHOULD be configured to prevent
			// routing of this prefix by default.

			address_v6 const a6 = a.to_v6();
			return a6.is_loopback()
				|| a6.is_link_local()
				|| a6.is_site_local()
				|| a6.is_multicast_link_local()
				|| a6.is_multicast_site_local()
				//  fc00::/7, unique local address
				|| (a6.to_bytes()[0] & 0xfe) == 0xfc;
		}
		address_v4 a4 = a.to_v4();
		unsigned long ip = a4.to_ulong();
		return ((ip & 0xff000000) == 0x0a000000 // 10.x.x.x
			|| (ip & 0xfff00000) == 0xac100000 // 172.16.x.x
			|| (ip & 0xffff0000) == 0xc0a80000 // 192.168.x.x
			|| (ip & 0xffff0000) == 0xa9fe0000 // 169.254.x.x
			|| (ip & 0xff000000) == 0x7f000000); // 127.x.x.x
	}